

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int get_thread_siblings(int cpuid)

{
  FILE *__stream;
  int thread_siblings;
  char path [256];
  int local_11c;
  char local_118 [264];
  
  sprintf(local_118,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings",cpuid);
  __stream = fopen(local_118,"rb");
  if (__stream == (FILE *)0x0) {
    local_11c = -1;
  }
  else {
    local_11c = -1;
    __isoc99_fscanf(__stream,"%x",&local_11c);
    fclose(__stream);
  }
  return local_11c;
}

Assistant:

static int get_thread_siblings(int cpuid)
{
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings", cpuid);

    FILE* fp = fopen(path, "rb");
    if (!fp)
        return -1;

    int thread_siblings = -1;
    int nscan = fscanf(fp, "%x", &thread_siblings);
    if (nscan != 1)
    {
        // ignore
    }

    fclose(fp);

    return thread_siblings;
}